

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localintermediate.h
# Opt level: O2

void __thiscall glslang::TIntermediate::setAtomicCounterBlockName(TIntermediate *this,char *name)

{
  allocator<char> local_31;
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_30,name,&local_31);
  std::__cxx11::string::operator=((string *)&this->atomicCounterBlockName,local_30);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void setAtomicCounterBlockName(const char* name) { atomicCounterBlockName = std::string(name); }